

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O2

void __thiscall
TileSwitch::TileSwitch
          (TileSwitch *this,Board *boardPtr,Vector2u *position,bool noAdjacentUpdates,char charID,
          State state)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  vector<TileSwitch*,std::allocator<TileSwitch*>> *this_00;
  Font *font;
  mapped_type *pmVar4;
  Vector2u *pVVar5;
  unordered_map<Tile_*,_sf::Text,_std::hash<Tile_*>,_std::equal_to<Tile_*>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>_>
  *this_01;
  char charID_local;
  key_type local_1d0;
  key_type local_1c8;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1c0;
  Text local_1a0;
  
  charID_local = charID;
  Tile::Tile(&this->super_Tile,boardPtr,position,true,true);
  (this->super_Tile)._vptr_Tile = (_func_int **)&PTR__TileSwitch_001c4fb8;
  (this->super_Tile).field_0x21 = charID;
  *(State *)&(this->super_Tile).field_0x24 = state;
  this_00 = (vector<TileSwitch*,std::allocator<TileSwitch*>> *)
            std::__detail::
            _Map_base<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&boardPtr->switchKeybinds,&charID_local);
  local_1a0.super_Drawable._vptr_Drawable = (_func_int **)this;
  std::vector<TileSwitch*,std::allocator<TileSwitch*>>::emplace_back<TileSwitch*>
            (this_00,(TileSwitch **)&local_1a0);
  std::locale::locale((locale *)&local_1c8);
  sf::String::String((String *)&local_1c0,"",(locale *)&local_1c8);
  font = Board::getFont();
  sf::Text::Text(&local_1a0,(String *)&local_1c0,font,0x19);
  this_01 = &boardPtr->tileLabels;
  local_1d0 = &this->super_Tile;
  pmVar4 = std::__detail::
           _Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,&local_1d0);
  sf::Text::operator=(pmVar4,&local_1a0);
  sf::Text::~Text(&local_1a0);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&local_1c0);
  std::locale::~locale((locale *)&local_1c8);
  local_1c8 = &this->super_Tile;
  pmVar4 = std::__detail::
           _Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,&local_1c8);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1c0,'\x01');
  std::locale::locale((locale *)&local_1d0);
  sf::String::String((String *)&local_1a0,(string *)&local_1c0,(locale *)&local_1d0);
  sf::Text::setString(pmVar4,(String *)&local_1a0);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&local_1a0);
  std::locale::~locale((locale *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1c0);
  local_1a0.super_Drawable._vptr_Drawable = (_func_int **)this;
  pmVar4 = std::__detail::
           _Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_01,(key_type *)&local_1a0);
  pVVar5 = Tile::getPosition(&this->super_Tile);
  uVar1 = pVVar5->x;
  pVVar5 = Board::getTileSize();
  uVar2 = pVVar5->x;
  pVVar5 = Tile::getPosition(&this->super_Tile);
  uVar3 = pVVar5->y;
  pVVar5 = Board::getTileSize();
  sf::Transformable::setPosition
            (&pmVar4->super_Transformable,(float)(uVar1 * uVar2) + 9.0,
             (float)(uVar3 * pVVar5->y) + -2.0);
  (*(this->super_Tile)._vptr_Tile[8])(this,0,(ulong)noAdjacentUpdates);
  return;
}

Assistant:

TileSwitch::TileSwitch(Board* boardPtr, const Vector2u& position, bool noAdjacentUpdates, char charID, State state) : Tile(boardPtr, position, true, true) {
    _charID = charID;
    _state = state;
    boardPtr->switchKeybinds[charID].push_back(this);
    boardPtr->tileLabels[this] = Text("", Board::getFont(), 25);
    boardPtr->tileLabels[this].setString(string(1, charID));
    boardPtr->tileLabels[this].setPosition(getPosition().x * Board::getTileSize().x + 9.0f, getPosition().y * Board::getTileSize().y - 2.0f);
    addUpdate(false, noAdjacentUpdates);
}